

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

void __thiscall cinatra::coro_http_client::reset(coro_http_client *this)

{
  bool bVar1;
  null_logger_t *this_00;
  socket_t *in_RDI;
  error_code ec;
  io_context *in_stack_ffffffffffffff18;
  undefined1 __i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  element_type *in_stack_ffffffffffffff30;
  error_code *this_01;
  _Alloc_hider in_stack_ffffffffffffff48;
  basic_streambuf<std::allocator<char>_> *in_stack_ffffffffffffff50;
  int local_84;
  error_code local_80 [2];
  error_code local_60 [6];
  
  bVar1 = has_closed((coro_http_client *)0x2ccab1);
  if (!bVar1) {
    std::
    __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_ffffffffffffff20);
    close_socket(in_RDI);
  }
  coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  context((ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)
          0x2ccadf);
  this_01 = local_60;
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
  basic_stream_socket<asio::io_context>
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,0);
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2ccb07);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::operator=
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_ffffffffffffff20,
             (basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_ffffffffffffff18)
  ;
  __i = (undefined1)((ulong)in_stack_ffffffffffffff18 >> 0x38);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::~basic_stream_socket
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)0x2ccb23);
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2ccb34);
  bVar1 = asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::is_open
                    ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_ffffffffffffff20
                    );
  if (!bVar1) {
    std::error_code::error_code((error_code *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff30 =
         std::
         __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ccb5f);
    local_84 = (int)asio::ip::tcp::v4();
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::open
              ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_ffffffffffffff30,
               (char *)&local_84,(int)local_80);
    bVar1 = std::error_code::operator_cast_to_bool(local_80);
    if (bVar1) {
      this_00 = null_logger_t::operator<<
                          ((null_logger_t *)&NULL_LOGGER,
                           (char (*) [37])"client reset socket failed, reason: ");
      std::error_code::message_abi_cxx11_(this_01);
      null_logger_t::operator<<
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff48);
      std::__cxx11::string::~string(in_stack_ffffffffffffff20);
      return;
    }
  }
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2ccc15);
  std::atomic<bool>::operator=((atomic<bool> *)in_stack_ffffffffffffff20,(bool)__i);
  asio::basic_streambuf<std::allocator<char>_>::size
            ((basic_streambuf<std::allocator<char>_> *)in_stack_ffffffffffffff30);
  asio::basic_streambuf<std::allocator<char>_>::consume
            (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48._M_p);
  asio::basic_streambuf<std::allocator<char>_>::size
            ((basic_streambuf<std::allocator<char>_> *)in_stack_ffffffffffffff30);
  asio::basic_streambuf<std::allocator<char>_>::consume
            (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ccc89);
  return;
}

Assistant:

void reset() {
    if (!has_closed()) {
      close_socket(*socket_);
    }

    socket_->impl_ = asio::ip::tcp::socket{executor_wrapper_.context()};
    if (!socket_->impl_.is_open()) {
      std::error_code ec;
      socket_->impl_.open(asio::ip::tcp::v4(), ec);
      if (ec) {
        CINATRA_LOG_WARNING << "client reset socket failed, reason: "
                            << ec.message();
        return;
      }
    }

    socket_->has_closed_ = true;
#ifdef CINATRA_ENABLE_SSL
    need_set_sni_host_ = true;
    if (has_init_ssl_) {
      socket_->ssl_stream_ = nullptr;
      socket_->ssl_stream_ =
          std::make_unique<asio::ssl::stream<asio::ip::tcp::socket &>>(
              socket_->impl_, *ssl_ctx_);
      has_init_ssl_ = false;
    }
#endif
#ifdef BENCHMARK_TEST
    total_len_ = 0;
#endif

    // clear
    head_buf_.consume(head_buf_.size());
    chunked_buf_.consume(chunked_buf_.size());
    resp_chunk_str_.clear();
  }